

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               _func_date_t_interval_t_date_t_interval_t *fun)

{
  interval_t c_00;
  interval_t a_00;
  VectorType VVar1;
  bool bVar2;
  date_t dVar3;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  UnifiedVectorFormat cdata_1;
  UnifiedVectorFormat bdata_1;
  UnifiedVectorFormat adata_1;
  ValidityMask *result_validity;
  date_t *result_data;
  interval_t *cdata;
  date_t *bdata;
  interval_t *adata;
  _func_date_t_interval_t_date_t_interval_t *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  int64_t in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  int64_t in_stack_fffffffffffffe18;
  ValidityMask *in_stack_fffffffffffffe30;
  idx_t in_stack_fffffffffffffe38;
  UnifiedVectorFormat *local_198 [2];
  SelectionVector *in_stack_fffffffffffffe78;
  idx_t in_stack_fffffffffffffe80;
  date_t *in_stack_fffffffffffffe88;
  interval_t *in_stack_fffffffffffffe90;
  date_t *in_stack_fffffffffffffe98;
  interval_t *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffeb0;
  SelectionVector *in_stack_fffffffffffffeb8;
  ValidityMask *in_stack_fffffffffffffec0;
  ValidityMask *in_stack_fffffffffffffec8;
  ValidityMask *in_stack_fffffffffffffed0;
  ValidityMask *in_stack_fffffffffffffed8;
  _func_date_t_interval_t_date_t_interval_t *in_stack_fffffffffffffee0;
  UnifiedVectorFormat local_f8 [72];
  undefined8 local_b0;
  int64_t local_a8;
  int32_t local_9c;
  undefined8 local_98;
  int64_t local_90;
  ValidityMask *local_80;
  date_t *local_78;
  interval_t *local_70;
  date_t *local_68;
  interval_t *local_60;
  UnifiedVectorFormat *local_50;
  Vector *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  
  dVar3.days = (int32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_50 = in_R8;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (((VVar1 == CONSTANT_VECTOR) &&
      (VVar1 = Vector::GetVectorType(local_38), VVar1 == CONSTANT_VECTOR)) &&
     (VVar1 = Vector::GetVectorType(local_40), VVar1 == CONSTANT_VECTOR)) {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    bVar2 = ConstantVector::IsNull((Vector *)0xcbaa9e);
    if (((bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0xcbaaaf), bVar2)) ||
       (bVar2 = ConstantVector::IsNull((Vector *)0xcbaac0), bVar2)) {
      duckdb::ConstantVector::SetNull(local_48,true);
    }
    else {
      local_60 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0xcbaaea);
      local_68 = ConstantVector::GetData<duckdb::date_t>((Vector *)0xcbaaff);
      local_70 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0xcbab14);
      local_78 = ConstantVector::GetData<duckdb::date_t>((Vector *)0xcbab29);
      local_80 = ConstantVector::Validity(local_48);
      local_98._0_4_ = local_60->months;
      local_98._4_4_ = local_60->days;
      local_90 = local_60->micros;
      local_9c = local_68->days;
      local_b0._0_4_ = local_70->months;
      local_b0._4_4_ = local_70->days;
      local_a8 = local_70->micros;
      a_00.micros = in_stack_fffffffffffffe18;
      a_00.months = (int)in_stack_fffffffffffffe10;
      a_00.days = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      c_00.micros = in_stack_fffffffffffffe00;
      c_00.months = (int)in_stack_fffffffffffffdf8;
      c_00.days = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      dVar3 = TernaryLambdaWrapper::
              Operation<duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t),duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                        (in_stack_fffffffffffffdf0,a_00,dVar3,c_00,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe38);
      local_78->days = dVar3.days;
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_f8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)&stack0xfffffffffffffec0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_198);
    duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_38,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_40,local_50);
    UnifiedVectorFormat::GetData<duckdb::interval_t>(local_f8);
    UnifiedVectorFormat::GetData<duckdb::date_t>((UnifiedVectorFormat *)&stack0xfffffffffffffec0);
    UnifiedVectorFormat::GetData<duckdb::interval_t>((UnifiedVectorFormat *)local_198);
    FlatVector::GetData<duckdb::date_t>((Vector *)0xcbacd8);
    FlatVector::Validity((Vector *)0xcbad4e);
    ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffee0);
    UnifiedVectorFormat::~UnifiedVectorFormat(local_198[0]);
    UnifiedVectorFormat::~UnifiedVectorFormat(local_198[0]);
    UnifiedVectorFormat::~UnifiedVectorFormat(local_198[0]);
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUN fun) {
		if (a.GetVectorType() == VectorType::CONSTANT_VECTOR && b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    c.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (ConstantVector::IsNull(a) || ConstantVector::IsNull(b) || ConstantVector::IsNull(c)) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<A_TYPE>(a);
				auto bdata = ConstantVector::GetData<B_TYPE>(b);
				auto cdata = ConstantVector::GetData<C_TYPE>(c);
				auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
				auto &result_validity = ConstantVector::Validity(result);
				result_data[0] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[0], bdata[0], cdata[0], result_validity, 0);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);

			UnifiedVectorFormat adata, bdata, cdata;
			a.ToUnifiedFormat(count, adata);
			b.ToUnifiedFormat(count, bdata);
			c.ToUnifiedFormat(count, cdata);

			ExecuteLoop<A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE, OPWRAPPER>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), FlatVector::GetData<RESULT_TYPE>(result), count,
			    *adata.sel, *bdata.sel, *cdata.sel, adata.validity, bdata.validity, cdata.validity,
			    FlatVector::Validity(result), fun);
		}
	}